

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

void __thiscall Assimp::Importer::~Importer(Importer *this)

{
  IOSystem *pIVar1;
  ProgressHandler *pPVar2;
  aiScene *this_00;
  SharedPostProcessInfo *this_01;
  ImporterPimpl *this_02;
  size_type sVar3;
  reference ppBVar4;
  uint local_14;
  uint a;
  Importer *this_local;
  
  DeleteImporterInstanceList(&this->pimpl->mImporter);
  local_14 = 0;
  while( true ) {
    sVar3 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                      (&this->pimpl->mPostProcessingSteps);
    if (sVar3 <= local_14) break;
    ppBVar4 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::operator[]
                        (&this->pimpl->mPostProcessingSteps,(ulong)local_14);
    if (*ppBVar4 != (value_type)0x0) {
      (*(*ppBVar4)->_vptr_BaseProcess[1])();
    }
    local_14 = local_14 + 1;
  }
  pIVar1 = this->pimpl->mIOHandler;
  if (pIVar1 != (IOSystem *)0x0) {
    (*pIVar1->_vptr_IOSystem[1])();
  }
  pPVar2 = this->pimpl->mProgressHandler;
  if (pPVar2 != (ProgressHandler *)0x0) {
    (*pPVar2->_vptr_ProgressHandler[1])();
  }
  this_00 = this->pimpl->mScene;
  if (this_00 != (aiScene *)0x0) {
    aiScene::~aiScene(this_00);
    operator_delete(this_00,0x80);
  }
  this_01 = this->pimpl->mPPShared;
  if (this_01 != (SharedPostProcessInfo *)0x0) {
    SharedPostProcessInfo::~SharedPostProcessInfo(this_01);
    operator_delete(this_01,0x30);
  }
  this_02 = this->pimpl;
  if (this_02 != (ImporterPimpl *)0x0) {
    ImporterPimpl::~ImporterPimpl(this_02);
    operator_delete(this_02,0x148);
  }
  return;
}

Assistant:

Importer::~Importer()
{
    // Delete all import plugins
	DeleteImporterInstanceList(pimpl->mImporter);

    // Delete all post-processing plug-ins
    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)
        delete pimpl->mPostProcessingSteps[a];

    // Delete the assigned IO and progress handler
    delete pimpl->mIOHandler;
    delete pimpl->mProgressHandler;

    // Kill imported scene. Destructor's should do that recursively
    delete pimpl->mScene;

    // Delete shared post-processing data
    delete pimpl->mPPShared;

    // and finally the pimpl itself
    delete pimpl;
}